

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

char * Abc_SopCreateFromTruthIsop(Mem_Flex_t *pMan,int nVars,word *pTruth,Vec_Int_t *vCover)

{
  int iVar1;
  int RetValue;
  int nWords;
  int w;
  char *pSop;
  Vec_Int_t *vCover_local;
  word *pTruth_local;
  int nVars_local;
  Mem_Flex_t *pMan_local;
  
  iVar1 = Abc_Truth6WordNum(nVars);
  if (0xf < nVars) {
    __assert_fail("nVars < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                  ,0x1cd,"char *Abc_SopCreateFromTruthIsop(Mem_Flex_t *, int, word *, Vec_Int_t *)")
    ;
  }
  for (RetValue = 0; (RetValue < iVar1 && (pTruth[RetValue] == 0)); RetValue = RetValue + 1) {
  }
  if (RetValue == iVar1) {
    pMan_local = (Mem_Flex_t *)Abc_SopRegister(pMan," 0\n");
  }
  else {
    for (RetValue = 0; (RetValue < iVar1 && (pTruth[RetValue] == 0xffffffffffffffff));
        RetValue = RetValue + 1) {
    }
    if (RetValue == iVar1) {
      pMan_local = (Mem_Flex_t *)Abc_SopRegister(pMan," 1\n");
    }
    else {
      iVar1 = Kit_TruthIsop((uint *)pTruth,nVars,vCover,1);
      if (nVars < 1) {
        __assert_fail("nVars > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                      ,0x1dd,
                      "char *Abc_SopCreateFromTruthIsop(Mem_Flex_t *, int, word *, Vec_Int_t *)");
      }
      if ((iVar1 != 0) && (iVar1 != 1)) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                      ,0x1de,
                      "char *Abc_SopCreateFromTruthIsop(Mem_Flex_t *, int, word *, Vec_Int_t *)");
      }
      pMan_local = (Mem_Flex_t *)Abc_SopCreateFromIsop(pMan,nVars,vCover);
      if (iVar1 != 0) {
        Abc_SopComplement((char *)pMan_local);
      }
    }
  }
  return (char *)pMan_local;
}

Assistant:

char * Abc_SopCreateFromTruthIsop( Mem_Flex_t * pMan, int nVars, word * pTruth, Vec_Int_t * vCover )
{
    char * pSop = NULL;
    int w, nWords  = Abc_Truth6WordNum( nVars );
    assert( nVars < 16 );

    for ( w = 0; w < nWords; w++ )
        if ( pTruth[w] )
            break;
    if ( w == nWords )
        return Abc_SopRegister( pMan, " 0\n" );

    for ( w = 0; w < nWords; w++ )
        if ( ~pTruth[w] )
            break;
    if ( w == nWords )
        return Abc_SopRegister( pMan, " 1\n" );

    {
        int RetValue = Kit_TruthIsop( (unsigned *)pTruth, nVars, vCover, 1 );
        assert( nVars > 0 );
        assert( RetValue == 0 || RetValue == 1 );
        pSop = Abc_SopCreateFromIsop( pMan, nVars, vCover );
        if ( RetValue )
            Abc_SopComplement( pSop );
    }
    return pSop;
}